

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O0

S1Angle s2builderutil::IntLatLngSnapFunction::MinSnapRadiusForExponent(int exponent)

{
  S1Angle SVar1;
  S1Angle b;
  undefined4 local_24;
  double dStack_20;
  int i;
  double power;
  int exponent_local;
  
  dStack_20 = 1.0;
  for (local_24 = 0; local_24 < exponent; local_24 = local_24 + 1) {
    dStack_20 = dStack_20 * 10.0;
  }
  SVar1 = S1Angle::Degrees(0.7071067811865476 / dStack_20);
  b = S1Angle::Radians(3.1592333330183424e-15);
  SVar1 = ::operator+(SVar1,b);
  return (S1Angle)SVar1.radians_;
}

Assistant:

S1Angle IntLatLngSnapFunction::MinSnapRadiusForExponent(int exponent) {
  // snap_radius() needs to be an upper bound on the true distance that a
  // point can move when snapped, taking into account numerical errors.
  //
  // The maximum errors in latitude and longitude can be bounded as
  // follows (as absolute errors in terms of DBL_EPSILON):
  //
  //                                      Latitude      Longitude
  // Convert to S2LatLng:                    1.000          1.000
  // Convert to degrees:                     1.032          2.063
  // Scale by 10**exp:                       0.786          1.571
  // Round to integer: 0.5 * S1Angle::Degrees(to_degrees_)
  // Scale by 10**(-exp):                    1.375          2.749
  // Convert to radians:                     1.252          1.503
  // ------------------------------------------------------------
  // Total (except for rounding)             5.445          8.886
  //
  // The maximum error when converting the S2LatLng back to an S2Point is
  //
  //   sqrt(2) * (maximum error in latitude or longitude) + 1.5 * DBL_EPSILON
  //
  // which works out to (9 * sqrt(2) + 1.5) * DBL_EPSILON radians.  Finally
  // we need to consider the effect of rounding to integer coordinates
  // (much larger than the errors above), which can change the position by
  // up to (sqrt(2) * 0.5 * to_degrees_) radians.
  double power = 1;
  for (int i = 0; i < exponent; ++i) power *= 10;
  return (S1Angle::Degrees(M_SQRT1_2 / power) +
          S1Angle::Radians((9 * M_SQRT2 + 1.5) * DBL_EPSILON));
}